

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O3

FieldGeneratorInfo * __thiscall
google::protobuf::compiler::java::Context::GetFieldGeneratorInfo
          (Context *this,FieldDescriptor *field)

{
  _Base_ptr p_Var1;
  LogMessage *pLVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  LogFinisher local_49;
  LogMessage local_48;
  
  p_Var3 = (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var4 = &(this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var4->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var3 + 1) >= field) {
        p_Var1 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(FieldDescriptor **)(p_Var3 + 1) < field];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != p_Var4) && (*(FieldDescriptor **)(p_Var1 + 1) <= field)) {
      return (FieldGeneratorInfo *)&p_Var1[1]._M_parent;
    }
  }
  internal::LogMessage::LogMessage
            (&local_48,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
             ,0xaf);
  pLVar2 = internal::LogMessage::operator<<(&local_48,"Can not find FieldGeneratorInfo for field: ")
  ;
  pLVar2 = internal::LogMessage::operator<<(pLVar2,(string *)(*(long *)(field + 8) + 0x20));
  internal::LogFinisher::operator=(&local_49,pLVar2);
  internal::LogMessage::~LogMessage(&local_48);
  return (FieldGeneratorInfo *)0x0;
}

Assistant:

const FieldGeneratorInfo* Context::GetFieldGeneratorInfo(
    const FieldDescriptor* field) const {
  const FieldGeneratorInfo* result =
      FindOrNull(field_generator_info_map_, field);
  if (result == NULL) {
    GOOGLE_LOG(FATAL) << "Can not find FieldGeneratorInfo for field: "
               << field->full_name();
  }
  return result;
}